

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestPathVariables::RegisterParserTestPathVariables
          (RegisterParserTestPathVariables *this)

{
  RegisterParserTestPathVariables *this_local;
  
  RegisterTest(ParserTestPathVariables::Create,"ParserTest.PathVariables");
  return;
}

Assistant:

TEST_F(ParserTest, PathVariables) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"dir = out\n"
"build $dir/exe: cat src\n"));

  EXPECT_FALSE(state.LookupNode("$dir/exe"));
  EXPECT_TRUE(state.LookupNode("out/exe"));
}